

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

void jsoncons::detail::prettify_string<std::__cxx11::string>
               (char *buffer,size_t length,int k,int min_exp,int max_exp,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  char in_R9B;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int kk;
  int offset;
  int nb_digits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined4 local_50;
  int in_stack_ffffffffffffffb4;
  int iVar1;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  
  local_44 = in_ESI + in_EDX;
  if ((local_44 < in_ESI) || (in_R8D < local_44)) {
    if ((local_44 < 1) || (in_R8D < local_44)) {
      if ((in_ECX < local_44) && (local_44 < 1)) {
        std::__cxx11::string::push_back(in_R9B);
        std::__cxx11::string::push_back(in_R9B);
        for (local_48 = 2; local_48 < 2 - local_44; local_48 = local_48 + 1) {
          std::__cxx11::string::push_back(in_R9B);
        }
        for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
          std::__cxx11::string::push_back(in_R9B);
        }
      }
      else if (in_ESI == 1) {
        std::__cxx11::string::push_back(in_R9B);
        std::__cxx11::string::push_back(in_R9B);
        fill_exponent<std::__cxx11::string>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      }
      else {
        std::__cxx11::string::push_back(in_R9B);
        std::__cxx11::string::push_back(in_R9B);
        for (local_50 = 1; local_50 < in_ESI; local_50 = local_50 + 1) {
          std::__cxx11::string::push_back(in_R9B);
        }
        std::__cxx11::string::push_back(in_R9B);
        fill_exponent<std::__cxx11::string>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      }
    }
    else {
      for (local_40 = 0; local_40 < local_44; local_40 = local_40 + 1) {
        std::__cxx11::string::push_back(in_R9B);
      }
      std::__cxx11::string::push_back(in_R9B);
      for (; local_44 < in_ESI; local_44 = local_44 + 1) {
        std::__cxx11::string::push_back(in_R9B);
      }
    }
  }
  else {
    for (local_38 = 0; local_3c = in_ESI, local_38 < in_ESI; local_38 = local_38 + 1) {
      std::__cxx11::string::push_back(in_R9B);
    }
    for (; local_3c < local_44; local_3c = local_3c + 1) {
      std::__cxx11::string::push_back(in_R9B);
    }
    std::__cxx11::string::push_back(in_R9B);
    std::__cxx11::string::push_back(in_R9B);
  }
  return;
}

Assistant:

void prettify_string(const char *buffer, std::size_t length, int k, int min_exp, int max_exp, Result& result)
    {
        int nb_digits = (int)length;
        int offset;
        /* v = buffer * 10^k
           kk is such that 10^(kk-1) <= v < 10^kk
           this way kk gives the position of the decimal point.
        */
        int kk = nb_digits + k;

        if (nb_digits <= kk && kk <= max_exp)
        {
            /* the first digits are already in. Add some 0s and call it a day. */
            /* the max_exp is a personal choice. Only 16 digits could possibly be relevant.
             * Basically we want to print 12340000000 rather than 1234.0e7 or 1.234e10 */
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            for (int i = nb_digits; i < kk; ++i)
            {
                result.push_back('0');
            }
            result.push_back('.');
            result.push_back('0');
        } 
        else if (0 < kk && kk <= max_exp)
        {
            /* comma number. Just insert a '.' at the correct location. */
            for (int i = 0; i < kk; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('.');
            for (int i = kk; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (min_exp < kk && kk <= 0)
        {
            offset = 2 - kk;

            result.push_back('0');
            result.push_back('.');
            for (int i = 2; i < offset; ++i) 
                result.push_back('0');
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (nb_digits == 1)
        {
            result.push_back(buffer[0]);
            result.push_back('e');
            fill_exponent(kk - 1, result);
        } 
        else
        {
            result.push_back(buffer[0]);
            result.push_back('.');
            for (int i = 1; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('e');
            fill_exponent(kk - 1, result);
        }
    }